

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::texImage3D
          (ReferenceContext *this,deUint32 target,int level,deUint32 internalFormat,int width,
          int height,int depth,int border,deUint32 format,deUint32 type,void *data)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  CubeFace face_00;
  reference pvVar4;
  void *data_00;
  ConstPixelBufferAccess *pCVar5;
  TextureFormat *pTVar6;
  PixelBufferAccess *pPVar7;
  bool bVar8;
  bool bVar9;
  TextureCubeArray *local_4e8;
  Texture3D *local_4d0;
  Texture2DArray *local_4b8;
  TextureCube *local_4a0;
  Texture2D *local_488;
  Texture1D *local_478;
  PixelBufferAccess local_458;
  undefined1 local_430 [8];
  PixelBufferAccess dst_11;
  ConstPixelBufferAccess src_5;
  ConstPixelBufferAccess dst_10;
  TextureCubeArray *texture_5;
  undefined1 local_388 [8];
  PixelBufferAccess dst_9;
  ConstPixelBufferAccess src_4;
  ConstPixelBufferAccess dst_8;
  Texture3D *texture_4;
  undefined1 local_2e0 [8];
  PixelBufferAccess dst_7;
  ConstPixelBufferAccess src_3;
  ConstPixelBufferAccess dst_6;
  Texture2DArray *texture_3;
  undefined1 local_238 [8];
  PixelBufferAccess dst_5;
  ConstPixelBufferAccess src_2;
  ConstPixelBufferAccess dst_4;
  CubeFace face;
  TextureCube *texture_2;
  undefined1 local_188 [8];
  PixelBufferAccess dst_3;
  ConstPixelBufferAccess src_1;
  ConstPixelBufferAccess dst_2;
  Texture2D *texture_1;
  undefined1 local_e0 [8];
  PixelBufferAccess dst_1;
  ConstPixelBufferAccess src;
  ConstPixelBufferAccess dst;
  Texture1D *texture;
  TextureFormat local_4c;
  TextureFormat transferFmt;
  TextureFormat storageFmt;
  bool isDstFloatDepthFormat;
  void *unpackPtr;
  TextureUnit *unit;
  int height_local;
  int width_local;
  deUint32 internalFormat_local;
  int level_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  pvVar4 = std::
           vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ::operator[](&this->m_textureUnits,(long)this->m_activeTexture);
  data_00 = getPixelUnpackPtr(this,data);
  bVar8 = internalFormat != 0x8cac;
  bVar9 = internalFormat != 0x8cad;
  tcu::TextureFormat::TextureFormat(&transferFmt);
  tcu::TextureFormat::TextureFormat(&local_4c);
  do {
    if (border != 0) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    if ((((width < 0) || (height < 0)) || (depth < 0)) || (level < 0)) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  transferFmt = mapInternalFormat(internalFormat);
  do {
    if ((transferFmt.order == CHANNELORDER_LAST) || (transferFmt.type == CHANNELTYPE_LAST)) {
      setError(this,0x500);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  local_4c = glu::mapGLTransferFormat(format,type);
  do {
    if ((local_4c.order == CHANNELORDER_LAST) || (local_4c.type == CHANNELTYPE_LAST)) {
      setError(this,0x500);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if ((target == 0xde0) &&
     (bVar1 = glu::isContextTypeGLCore
                        ((ContextType)(this->m_limits).contextType.super_ApiType.m_bits), bVar1)) {
    do {
      if ((((this->m_limits).maxTexture2DSize < width) || (height != 1)) || (depth != 1)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = deLog2Floor32((this->m_limits).maxTexture2DSize);
      if (iVar3 < level) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (pvVar4->tex1DBinding == (Texture1D *)0x0) {
      local_478 = &pvVar4->default1DTex;
    }
    else {
      local_478 = pvVar4->tex1DBinding;
    }
    bVar1 = rc::Texture::isImmutable(&local_478->super_Texture);
    if (bVar1) {
      do {
        bVar1 = rc::Texture1D::hasLevel(local_478,level);
        if (!bVar1) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pCVar5 = &rc::Texture1D::getLevel(local_478,level)->super_ConstPixelBufferAccess;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&src.m_data,pCVar5);
      do {
        pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)&src.m_data);
        bVar1 = tcu::TextureFormat::operator!=(&transferFmt,pTVar6);
        if ((bVar1) ||
           (iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&src.m_data),
           width != iVar3)) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
    }
    else {
      rc::Texture1D::allocLevel(local_478,level,&transferFmt,width);
    }
    if (data_00 == (void *)0x0) {
      pPVar7 = rc::Texture1D::getLevel(local_478,level);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&texture_1,pPVar7);
      clearToTextureInitialValue((PixelBufferAccess *)&texture_1);
    }
    else {
      getUnpack2DAccess((ConstPixelBufferAccess *)&dst_1.super_ConstPixelBufferAccess.m_data,this,
                        &local_4c,width,1,data_00);
      pPVar7 = rc::Texture1D::getLevel(local_478,level);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_e0,pPVar7);
      if (bVar8 && bVar9) {
        tcu::copy((EVP_PKEY_CTX *)local_e0,
                  (EVP_PKEY_CTX *)&dst_1.super_ConstPixelBufferAccess.m_data);
      }
      else {
        depthValueFloatClampCopy
                  ((PixelBufferAccess *)local_e0,
                   (ConstPixelBufferAccess *)&dst_1.super_ConstPixelBufferAccess.m_data);
      }
    }
  }
  else if (target == 0xde1) {
    do {
      if ((((this->m_limits).maxTexture2DSize < width) ||
          ((this->m_limits).maxTexture2DSize < height)) || (depth != 1)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = deLog2Floor32((this->m_limits).maxTexture2DSize);
      if (iVar3 < level) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (pvVar4->tex2DBinding == (Texture2D *)0x0) {
      local_488 = &pvVar4->default2DTex;
    }
    else {
      local_488 = pvVar4->tex2DBinding;
    }
    bVar1 = rc::Texture::isImmutable(&local_488->super_Texture);
    if (bVar1) {
      do {
        bVar1 = rc::Texture2D::hasLevel(local_488,level);
        if (!bVar1) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pCVar5 = &rc::Texture2D::getLevel(local_488,level)->super_ConstPixelBufferAccess;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&src_1.m_data,pCVar5);
      do {
        pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)&src_1.m_data);
        bVar1 = tcu::TextureFormat::operator!=(&transferFmt,pTVar6);
        if (((bVar1) ||
            (iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&src_1.m_data),
            width != iVar3)) ||
           (iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&src_1.m_data),
           height != iVar3)) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
    }
    else {
      rc::Texture2D::allocLevel(local_488,level,&transferFmt,width,height);
    }
    if (data_00 == (void *)0x0) {
      pPVar7 = rc::Texture2D::getLevel(local_488,level);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&texture_2,pPVar7);
      clearToTextureInitialValue((PixelBufferAccess *)&texture_2);
    }
    else {
      getUnpack2DAccess((ConstPixelBufferAccess *)&dst_3.super_ConstPixelBufferAccess.m_data,this,
                        &local_4c,width,height,data_00);
      pPVar7 = rc::Texture2D::getLevel(local_488,level);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_188,pPVar7);
      if (bVar8 && bVar9) {
        tcu::copy((EVP_PKEY_CTX *)local_188,
                  (EVP_PKEY_CTX *)&dst_3.super_ConstPixelBufferAccess.m_data);
      }
      else {
        depthValueFloatClampCopy
                  ((PixelBufferAccess *)local_188,
                   (ConstPixelBufferAccess *)&dst_3.super_ConstPixelBufferAccess.m_data);
      }
    }
  }
  else if (((((target == 0x8516) || (target == 0x8515)) || (target == 0x8518)) ||
           ((target == 0x8517 || (target == 0x851a)))) || (target == 0x8519)) {
    do {
      if (((width != height) || ((this->m_limits).maxTextureCubeSize < width)) || (depth != 1)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = deLog2Floor32((this->m_limits).maxTextureCubeSize);
      if (iVar3 < level) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (pvVar4->texCubeBinding == (TextureCube *)0x0) {
      local_4a0 = &pvVar4->defaultCubeTex;
    }
    else {
      local_4a0 = pvVar4->texCubeBinding;
    }
    face_00 = mapGLCubeFace(target);
    bVar1 = rc::Texture::isImmutable(&local_4a0->super_Texture);
    if (bVar1) {
      do {
        bVar1 = rc::TextureCube::hasFace(local_4a0,level,face_00);
        if (!bVar1) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pCVar5 = &rc::TextureCube::getFace(local_4a0,level,face_00)->super_ConstPixelBufferAccess;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&src_2.m_data,pCVar5);
      do {
        pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)&src_2.m_data);
        bVar1 = tcu::TextureFormat::operator!=(&transferFmt,pTVar6);
        if (((bVar1) ||
            (iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&src_2.m_data),
            width != iVar3)) ||
           (iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&src_2.m_data),
           height != iVar3)) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
    }
    else {
      rc::TextureCube::allocFace(local_4a0,level,face_00,&transferFmt,width,height);
    }
    if (data_00 == (void *)0x0) {
      pPVar7 = rc::TextureCube::getFace(local_4a0,level,face_00);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&texture_3,pPVar7);
      clearToTextureInitialValue((PixelBufferAccess *)&texture_3);
    }
    else {
      getUnpack2DAccess((ConstPixelBufferAccess *)&dst_5.super_ConstPixelBufferAccess.m_data,this,
                        &local_4c,width,height,data_00);
      pPVar7 = rc::TextureCube::getFace(local_4a0,level,face_00);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_238,pPVar7);
      if (bVar8 && bVar9) {
        tcu::copy((EVP_PKEY_CTX *)local_238,
                  (EVP_PKEY_CTX *)&dst_5.super_ConstPixelBufferAccess.m_data);
      }
      else {
        depthValueFloatClampCopy
                  ((PixelBufferAccess *)local_238,
                   (ConstPixelBufferAccess *)&dst_5.super_ConstPixelBufferAccess.m_data);
      }
    }
  }
  else if (target == 0x8c1a) {
    do {
      if ((((this->m_limits).maxTexture2DSize < width) ||
          ((this->m_limits).maxTexture2DSize < height)) ||
         ((this->m_limits).maxTexture2DArrayLayers < depth)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = deLog2Floor32((this->m_limits).maxTexture2DSize);
      if (iVar3 < level) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (pvVar4->tex2DArrayBinding == (Texture2DArray *)0x0) {
      local_4b8 = &pvVar4->default2DArrayTex;
    }
    else {
      local_4b8 = pvVar4->tex2DArrayBinding;
    }
    bVar1 = rc::Texture::isImmutable(&local_4b8->super_Texture);
    if (bVar1) {
      do {
        bVar1 = rc::Texture2DArray::hasLevel(local_4b8,level);
        if (!bVar1) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pCVar5 = &rc::Texture2DArray::getLevel(local_4b8,level)->super_ConstPixelBufferAccess;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&src_3.m_data,pCVar5);
      do {
        pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)&src_3.m_data);
        bVar1 = tcu::TextureFormat::operator!=(&transferFmt,pTVar6);
        if ((((bVar1) ||
             (iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&src_3.m_data)
             , width != iVar3)) ||
            (iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&src_3.m_data)
            , height != iVar3)) ||
           (iVar3 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)&src_3.m_data),
           depth != iVar3)) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
    }
    else {
      rc::Texture2DArray::allocLevel(local_4b8,level,&transferFmt,width,height,depth);
    }
    if (data_00 == (void *)0x0) {
      pPVar7 = rc::Texture2DArray::getLevel(local_4b8,level);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&texture_4,pPVar7);
      clearToTextureInitialValue((PixelBufferAccess *)&texture_4);
    }
    else {
      getUnpack3DAccess((ConstPixelBufferAccess *)&dst_7.super_ConstPixelBufferAccess.m_data,this,
                        &local_4c,width,height,depth,data_00);
      pPVar7 = rc::Texture2DArray::getLevel(local_4b8,level);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_2e0,pPVar7);
      if (bVar8 && bVar9) {
        tcu::copy((EVP_PKEY_CTX *)local_2e0,
                  (EVP_PKEY_CTX *)&dst_7.super_ConstPixelBufferAccess.m_data);
      }
      else {
        depthValueFloatClampCopy
                  ((PixelBufferAccess *)local_2e0,
                   (ConstPixelBufferAccess *)&dst_7.super_ConstPixelBufferAccess.m_data);
      }
    }
  }
  else if (target == 0x806f) {
    do {
      if ((((this->m_limits).maxTexture3DSize < width) ||
          ((this->m_limits).maxTexture3DSize < height)) ||
         ((this->m_limits).maxTexture3DSize < depth)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = deLog2Floor32((this->m_limits).maxTexture3DSize);
      if (iVar3 < level) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (pvVar4->tex3DBinding == (Texture3D *)0x0) {
      local_4d0 = &pvVar4->default3DTex;
    }
    else {
      local_4d0 = pvVar4->tex3DBinding;
    }
    bVar1 = rc::Texture::isImmutable(&local_4d0->super_Texture);
    if (bVar1) {
      do {
        bVar1 = rc::Texture3D::hasLevel(local_4d0,level);
        if (!bVar1) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pCVar5 = &rc::Texture3D::getLevel(local_4d0,level)->super_ConstPixelBufferAccess;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&src_4.m_data,pCVar5);
      do {
        pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)&src_4.m_data);
        bVar1 = tcu::TextureFormat::operator!=(&transferFmt,pTVar6);
        if (((bVar1) ||
            (iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&src_4.m_data),
            width != iVar3)) ||
           ((iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&src_4.m_data)
            , height != iVar3 ||
            (iVar3 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)&src_4.m_data),
            depth != iVar3)))) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
    }
    else {
      rc::Texture3D::allocLevel(local_4d0,level,&transferFmt,width,height,depth);
    }
    if (data_00 == (void *)0x0) {
      pPVar7 = rc::Texture3D::getLevel(local_4d0,level);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&texture_5,pPVar7);
      clearToTextureInitialValue((PixelBufferAccess *)&texture_5);
    }
    else {
      getUnpack3DAccess((ConstPixelBufferAccess *)&dst_9.super_ConstPixelBufferAccess.m_data,this,
                        &local_4c,width,height,depth,data_00);
      pPVar7 = rc::Texture3D::getLevel(local_4d0,level);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_388,pPVar7);
      if (bVar8 && bVar9) {
        tcu::copy((EVP_PKEY_CTX *)local_388,
                  (EVP_PKEY_CTX *)&dst_9.super_ConstPixelBufferAccess.m_data);
      }
      else {
        depthValueFloatClampCopy
                  ((PixelBufferAccess *)local_388,
                   (ConstPixelBufferAccess *)&dst_9.super_ConstPixelBufferAccess.m_data);
      }
    }
  }
  else if (target == 0x9009) {
    do {
      if (((width != height) || ((this->m_limits).maxTexture2DSize < width)) ||
         ((depth % 6 != 0 || ((this->m_limits).maxTexture2DArrayLayers < depth)))) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = deLog2Floor32((this->m_limits).maxTexture2DSize);
      if (iVar3 < level) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (pvVar4->texCubeArrayBinding == (TextureCubeArray *)0x0) {
      local_4e8 = &pvVar4->defaultCubeArrayTex;
    }
    else {
      local_4e8 = pvVar4->texCubeArrayBinding;
    }
    bVar1 = rc::Texture::isImmutable(&local_4e8->super_Texture);
    if (bVar1) {
      do {
        bVar1 = rc::TextureCubeArray::hasLevel(local_4e8,level);
        if (!bVar1) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pCVar5 = &rc::TextureCubeArray::getLevel(local_4e8,level)->super_ConstPixelBufferAccess;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&src_5.m_data,pCVar5);
      do {
        pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)&src_5.m_data);
        bVar1 = tcu::TextureFormat::operator!=(&transferFmt,pTVar6);
        if (((bVar1) ||
            (iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&src_5.m_data),
            width != iVar3)) ||
           ((iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&src_5.m_data)
            , height != iVar3 ||
            (iVar3 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)&src_5.m_data),
            depth != iVar3)))) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
    }
    else {
      rc::TextureCubeArray::allocLevel(local_4e8,level,&transferFmt,width,height,depth);
    }
    if (data_00 == (void *)0x0) {
      pPVar7 = rc::TextureCubeArray::getLevel(local_4e8,level);
      tcu::PixelBufferAccess::PixelBufferAccess(&local_458,pPVar7);
      clearToTextureInitialValue(&local_458);
    }
    else {
      getUnpack3DAccess((ConstPixelBufferAccess *)&dst_11.super_ConstPixelBufferAccess.m_data,this,
                        &local_4c,width,height,depth,data_00);
      pPVar7 = rc::TextureCubeArray::getLevel(local_4e8,level);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_430,pPVar7);
      if (bVar8 && bVar9) {
        tcu::copy((EVP_PKEY_CTX *)local_430,
                  (EVP_PKEY_CTX *)&dst_11.super_ConstPixelBufferAccess.m_data);
      }
      else {
        depthValueFloatClampCopy
                  ((PixelBufferAccess *)local_430,
                   (ConstPixelBufferAccess *)&dst_11.super_ConstPixelBufferAccess.m_data);
      }
    }
  }
  else {
    setError(this,0x500);
  }
  return;
}

Assistant:

void ReferenceContext::texImage3D (deUint32 target, int level, deUint32 internalFormat, int width, int height, int depth, int border, deUint32 format, deUint32 type, const void* data)
{
	TextureUnit&		unit					= m_textureUnits[m_activeTexture];
	const void*			unpackPtr				= getPixelUnpackPtr(data);
	const bool			isDstFloatDepthFormat	= (internalFormat == GL_DEPTH_COMPONENT32F || internalFormat == GL_DEPTH32F_STENCIL8); // depth components are limited to [0,1] range
	TextureFormat		storageFmt;
	TextureFormat		transferFmt;

	RC_IF_ERROR(border != 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0 || depth < 0 || level < 0, GL_INVALID_VALUE, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	// Map transfer format.
	transferFmt = glu::mapGLTransferFormat(format, type);
	RC_IF_ERROR(transferFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				transferFmt.type	== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_1D && glu::isContextTypeGLCore(m_limits.contextType))
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height != 1 || depth != 1, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture1D* texture = unit.tex1DBinding ? unit.tex1DBinding : &unit.default1DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack2DAccess(transferFmt, width, 1, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_2D)
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height > m_limits.maxTexture2DSize || depth != 1, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture2D* texture = unit.tex2DBinding ? unit.tex2DBinding : &unit.default2DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack2DAccess(transferFmt, width, height, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		// Validate size and level.
		RC_IF_ERROR(width != height || width > m_limits.maxTextureCubeSize || depth != 1, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTextureCubeSize), GL_INVALID_VALUE, RC_RET_VOID);

		TextureCube*	texture	= unit.texCubeBinding ? unit.texCubeBinding : &unit.defaultCubeTex;
		tcu::CubeFace	face	= mapGLCubeFace(target);

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasFace(level, face), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getFace(level, face));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocFace(level, face, storageFmt, width, height);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack2DAccess(transferFmt, width, height, unpackPtr);
			PixelBufferAccess		dst		(texture->getFace(level, face));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getFace(level, face));
		}
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		// Validate size and level.
		RC_IF_ERROR(width	> m_limits.maxTexture2DSize ||
					height	> m_limits.maxTexture2DSize ||
					depth	> m_limits.maxTexture2DArrayLayers, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture2DArray* texture = unit.tex2DArrayBinding ? unit.tex2DArrayBinding : &unit.default2DArrayTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight()	||
						depth		!= dst.getDepth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height, depth);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack3DAccess(transferFmt, width, height, depth, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_3D)
	{
		// Validate size and level.
		RC_IF_ERROR(width	> m_limits.maxTexture3DSize ||
					height	> m_limits.maxTexture3DSize ||
					depth	> m_limits.maxTexture3DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture3DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture3D* texture = unit.tex3DBinding ? unit.tex3DBinding : &unit.default3DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight()	||
						depth		!= dst.getDepth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height, depth);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack3DAccess(transferFmt, width, height, depth, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		// Validate size and level.
		RC_IF_ERROR(width		!= height						||
					width		 > m_limits.maxTexture2DSize	||
					depth % 6	!= 0							||
					depth		 > m_limits.maxTexture2DArrayLayers, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		TextureCubeArray* texture = unit.texCubeArrayBinding ? unit.texCubeArrayBinding : &unit.defaultCubeArrayTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight()	||
						depth		!= dst.getDepth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height, depth);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack3DAccess(transferFmt, width, height, depth, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}